

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.c
# Opt level: O3

void chacha_block(mi_random_ctx_t *ctx)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint local_90;
  uint local_8c;
  uint local_88 [18];
  ulong local_40;
  
  local_88[4] = (uint)*(undefined8 *)(ctx->input + 4);
  local_88[5] = (uint)((ulong)*(undefined8 *)(ctx->input + 4) >> 0x20);
  local_88[0] = (uint)*(undefined8 *)ctx->input;
  local_88[1] = (uint)((ulong)*(undefined8 *)ctx->input >> 0x20);
  local_8c = local_88[1];
  local_88[0xc] = (uint)*(undefined8 *)(ctx->input + 0xc);
  local_88[0xd] = (uint)((ulong)*(undefined8 *)(ctx->input + 0xc) >> 0x20);
  local_88[8] = (uint)*(undefined8 *)(ctx->input + 8);
  local_88[9] = (uint)((ulong)*(undefined8 *)(ctx->input + 8) >> 0x20);
  local_90 = local_88[9];
  local_88[6] = (uint)*(undefined8 *)(ctx->input + 6);
  local_88[2] = (uint)*(undefined8 *)(ctx->input + 2);
  local_88[0xe] = (uint)*(undefined8 *)(ctx->input + 0xe);
  local_88[10] = (uint)*(undefined8 *)(ctx->input + 10);
  local_88[7] = (uint)((ulong)*(undefined8 *)(ctx->input + 6) >> 0x20);
  local_88[3] = (uint)((ulong)*(undefined8 *)(ctx->input + 2) >> 0x20);
  local_88[0xf] = (uint)((ulong)*(undefined8 *)(ctx->input + 0xe) >> 0x20);
  local_40 = 0xfffffffffffffffe;
  local_88[0xb] = (uint)((ulong)*(undefined8 *)(ctx->input + 10) >> 0x20);
  do {
    local_88[0x11] = local_88[2];
    local_88[0xc] = local_88[0xc] ^ local_88[0] + local_88[4];
    uVar7 = local_88[0xc] << 0x10 | local_88[0xc] >> 0x10;
    local_88[8] = local_88[8] + uVar7;
    uVar8 = local_88[4] ^ local_88[8];
    uVar9 = uVar8 << 0xc | uVar8 >> 0x14;
    local_88[0] = local_88[0] + local_88[4] + uVar9;
    uVar7 = uVar7 ^ local_88[0];
    uVar8 = uVar7 << 8 | uVar7 >> 0x18;
    local_88[8] = local_88[8] + uVar8;
    uVar9 = uVar9 ^ local_88[8];
    uVar10 = uVar9 << 7 | uVar9 >> 0x19;
    local_88[0xd] = local_88[0xd] ^ local_8c + local_88[5];
    uVar9 = local_88[0xd] << 0x10 | local_88[0xd] >> 0x10;
    local_90 = local_90 + uVar9;
    uVar7 = local_88[5] ^ local_90;
    uVar7 = uVar7 << 0xc | uVar7 >> 0x14;
    local_8c = local_8c + local_88[5] + uVar7;
    uVar9 = uVar9 ^ local_8c;
    uVar9 = uVar9 << 8 | uVar9 >> 0x18;
    local_90 = local_90 + uVar9;
    uVar7 = uVar7 ^ local_90;
    uVar7 = uVar7 << 7 | uVar7 >> 0x19;
    local_88[0xe] = local_88[0xe] ^ local_88[2] + local_88[6];
    uVar12 = local_88[0xe] << 0x10 | local_88[0xe] >> 0x10;
    local_88[10] = local_88[10] + uVar12;
    uVar11 = local_88[6] ^ local_88[10];
    uVar11 = uVar11 << 0xc | uVar11 >> 0x14;
    local_88[2] = local_88[2] + local_88[6] + uVar11;
    uVar12 = uVar12 ^ local_88[2];
    uVar13 = uVar12 << 8 | uVar12 >> 0x18;
    local_88[10] = local_88[10] + uVar13;
    uVar11 = uVar11 ^ local_88[10];
    uVar12 = uVar11 << 7 | uVar11 >> 0x19;
    local_88[0xf] = local_88[0xf] ^ local_88[3] + local_88[7];
    uVar14 = local_88[0xf] << 0x10 | local_88[0xf] >> 0x10;
    local_88[0xb] = local_88[0xb] + uVar14;
    uVar11 = local_88[7] ^ local_88[0xb];
    uVar11 = uVar11 << 0xc | uVar11 >> 0x14;
    local_88[3] = local_88[3] + local_88[7] + uVar11;
    uVar14 = uVar14 ^ local_88[3];
    uVar14 = uVar14 << 8 | uVar14 >> 0x18;
    local_88[0xb] = local_88[0xb] + uVar14;
    uVar11 = uVar11 ^ local_88[0xb];
    uVar11 = uVar11 << 7 | uVar11 >> 0x19;
    local_88[0] = local_88[0] + uVar7;
    uVar14 = uVar14 ^ local_88[0];
    uVar14 = uVar14 << 0x10 | uVar14 >> 0x10;
    local_88[10] = local_88[10] + uVar14;
    uVar7 = uVar7 ^ local_88[10];
    uVar7 = uVar7 << 0xc | uVar7 >> 0x14;
    local_88[0] = local_88[0] + uVar7;
    uVar14 = uVar14 ^ local_88[0];
    local_88[0xf] = uVar14 << 8 | uVar14 >> 0x18;
    local_88[10] = local_88[10] + local_88[0xf];
    uVar7 = uVar7 ^ local_88[10];
    local_88[5] = uVar7 << 7 | uVar7 >> 0x19;
    local_8c = local_8c + uVar12;
    uVar8 = uVar8 ^ local_8c;
    uVar7 = uVar8 << 0x10 | uVar8 >> 0x10;
    local_88[0xb] = local_88[0xb] + uVar7;
    uVar12 = uVar12 ^ local_88[0xb];
    uVar8 = uVar12 << 0xc | uVar12 >> 0x14;
    local_8c = local_8c + uVar8;
    uVar7 = uVar7 ^ local_8c;
    local_88[0xc] = uVar7 << 8 | uVar7 >> 0x18;
    local_88[0xb] = local_88[0xb] + local_88[0xc];
    uVar8 = uVar8 ^ local_88[0xb];
    local_88[6] = uVar8 << 7 | uVar8 >> 0x19;
    local_88[2] = local_88[2] + uVar11;
    uVar9 = uVar9 ^ local_88[2];
    uVar7 = uVar9 << 0x10 | uVar9 >> 0x10;
    local_88[8] = local_88[8] + uVar7;
    uVar11 = uVar11 ^ local_88[8];
    uVar8 = uVar11 << 0xc | uVar11 >> 0x14;
    local_88[2] = local_88[2] + uVar8;
    uVar7 = uVar7 ^ local_88[2];
    local_88[0xd] = uVar7 << 8 | uVar7 >> 0x18;
    local_88[8] = local_88[8] + local_88[0xd];
    uVar8 = uVar8 ^ local_88[8];
    local_88[7] = uVar8 << 7 | uVar8 >> 0x19;
    local_88[3] = local_88[3] + uVar10;
    uVar13 = uVar13 ^ local_88[3];
    uVar8 = uVar13 << 0x10 | uVar13 >> 0x10;
    local_90 = local_90 + uVar8;
    uVar10 = uVar10 ^ local_90;
    uVar7 = uVar10 << 0xc | uVar10 >> 0x14;
    local_88[3] = local_88[3] + uVar7;
    uVar8 = uVar8 ^ local_88[3];
    local_88[0xe] = uVar8 << 8 | uVar8 >> 0x18;
    local_90 = local_90 + local_88[0xe];
    uVar7 = uVar7 ^ local_90;
    local_88[4] = uVar7 << 7 | uVar7 >> 0x19;
    local_40 = local_40 + 2;
  } while (local_40 < 0x12);
  local_88[1] = local_8c;
  local_88[9] = local_90;
  lVar6 = 0;
  do {
    puVar1 = ctx->input + lVar6;
    uVar3 = puVar1[1];
    uVar4 = puVar1[2];
    uVar5 = puVar1[3];
    uVar7 = local_88[lVar6 + 1];
    uVar8 = local_88[lVar6 + 2];
    uVar9 = local_88[lVar6 + 3];
    puVar2 = ctx->output + lVar6;
    *puVar2 = *puVar1 + local_88[lVar6];
    puVar2[1] = uVar3 + uVar7;
    puVar2[2] = uVar4 + uVar8;
    puVar2[3] = uVar5 + uVar9;
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x10);
  ctx->output_available = 0x10;
  puVar1 = ctx->input + 0xc;
  *puVar1 = *puVar1 + 1;
  if (*puVar1 == 0) {
    puVar1 = ctx->input + 0xd;
    *puVar1 = *puVar1 + 1;
    if (*puVar1 == 0) {
      ctx->input[0xe] = ctx->input[0xe] + 1;
    }
  }
  return;
}

Assistant:

static void chacha_block(mi_random_ctx_t* ctx)
{
  // scramble into `x`
  uint32_t x[16];
  for (size_t i = 0; i < 16; i++) {
    x[i] = ctx->input[i];
  }
  for (size_t i = 0; i < MI_CHACHA_ROUNDS; i += 2) {
    qround(x, 0, 4,  8, 12);
    qround(x, 1, 5,  9, 13);
    qround(x, 2, 6, 10, 14);
    qround(x, 3, 7, 11, 15);
    qround(x, 0, 5, 10, 15);
    qround(x, 1, 6, 11, 12);
    qround(x, 2, 7,  8, 13);
    qround(x, 3, 4,  9, 14);
  }

  // add scrambled data to the initial state
  for (size_t i = 0; i < 16; i++) {
    ctx->output[i] = x[i] + ctx->input[i];
  }
  ctx->output_available = 16;

  // increment the counter for the next round
  ctx->input[12] += 1;
  if (ctx->input[12] == 0) {
    ctx->input[13] += 1;
    if (ctx->input[13] == 0) {  // and keep increasing into the nonce
      ctx->input[14] += 1;
    }
  }
}